

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O1

void __thiscall
cfd::SignParameter::SignParameter
          (SignParameter *this,string *text_message,bool der_encode,SigHashType *sighash_type)

{
  pointer puVar1;
  bool bVar2;
  value_type_conflict *__val;
  vector<unsigned_char,_std::allocator<unsigned_char>_> list;
  undefined1 local_88 [8];
  pointer puStack_80;
  _Alloc_hider local_78;
  uchar local_68 [16];
  ByteData local_58;
  Pubkey *local_38;
  
  core::ByteData::ByteData(&this->data_);
  this->data_type_ = kBinary;
  local_38 = &this->related_pubkey_;
  core::Pubkey::Pubkey(local_38);
  this->der_encode_ = false;
  core::SigHashType::SigHashType(&this->sighash_type_);
  core::ScriptOperator::ScriptOperator
            (&this->op_code_,(ScriptOperator *)core::ScriptOperator::OP_INVALIDOPCODE);
  bVar2 = core::ScriptOperator::IsValid(text_message);
  if (bVar2) {
    this->data_type_ = kOpCode;
    core::ScriptOperator::Get((ScriptOperator *)local_88,text_message);
    core::ScriptOperator::operator=(&this->op_code_,(ScriptOperator *)local_88);
    local_88 = (undefined1  [8])&PTR__ScriptOperator_00734d50;
    if ((uchar *)local_78._M_p != local_68) {
      operator_delete(local_78._M_p);
    }
    local_88 = (undefined1  [8])0x0;
    puStack_80 = (pointer)0x0;
    local_78._M_p = (pointer)0x0;
    local_88 = (undefined1  [8])operator_new(1);
    puStack_80 = (pointer)((long)local_88 + 1);
    *(undefined1 *)local_88 = 0;
    *(char *)local_88 = (char)(this->op_code_).data_type_;
    local_78._M_p = (pointer)puStack_80;
    core::ByteData::ByteData
              (&local_58,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
    puVar1 = (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    if (local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_88 != (undefined1  [8])0x0) {
      operator_delete((void *)local_88);
    }
  }
  else {
    core::ByteData::ByteData((ByteData *)local_88,text_message);
    puVar1 = (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_88;
    (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_80;
    (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_78._M_p;
    local_88 = (undefined1  [8])0x0;
    puStack_80 = (pointer)0x0;
    local_78._M_p = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    if (local_88 != (undefined1  [8])0x0) {
      operator_delete((void *)local_88);
    }
    this->der_encode_ = der_encode;
    core::SigHashType::operator=(&this->sighash_type_,sighash_type);
    if (der_encode) {
      this->data_type_ = kSign;
    }
  }
  return;
}

Assistant:

SignParameter::SignParameter(
    const std::string& text_message, bool der_encode,
    const SigHashType sighash_type)
    : data_(),
      data_type_(SignDataType::kBinary),
      related_pubkey_(),
      der_encode_(false),
      sighash_type_(),
      op_code_(ScriptOperator::OP_INVALIDOPCODE) {
  if (ScriptOperator::IsValid(text_message)) {
    data_type_ = SignDataType::kOpCode;
    op_code_ = ScriptOperator::Get(text_message);
    std::vector<uint8_t> list(1);
    list[0] = static_cast<uint8_t>(op_code_.GetDataType());
    data_ = ByteData(list);
  } else {
    data_ = ByteData(text_message);
    der_encode_ = der_encode;
    sighash_type_ = sighash_type;
    if (der_encode) data_type_ = SignDataType::kSign;
  }
}